

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pssize p_socket_receive_from
                 (PSocket *socket,PSocketAddress **address,pchar *buffer,psize buflen,PError **error
                 )

{
  PSocketAddress **ppPVar1;
  pboolean pVar2;
  pint err_code;
  PErrorIO code;
  ssize_t sVar3;
  PSocketAddress *pPVar4;
  char *message;
  socklen_t optlen;
  PSocketAddress **local_b8;
  sockaddr_storage sa;
  
  if (((socket == (PSocket *)0x0) || (buffer == (pchar *)0x0)) || (buflen == 0)) {
    message = "Invalid input argument";
    code = P_ERROR_IO_INVALID_ARGUMENT;
    err_code = 0;
  }
  else {
    pVar2 = pp_socket_check(socket,error);
    if (pVar2 == 0) {
      return -1;
    }
    optlen = 0x80;
    local_b8 = address;
    do {
      if (((socket->field_0x18 & 1) != 0) &&
         (pVar2 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLIN,error), pVar2 == 0)
         ) {
        return -1;
      }
      sVar3 = recvfrom(socket->fd,buffer,buflen & 0xffffffff,0,(sockaddr *)&sa,&optlen);
      ppPVar1 = local_b8;
      if (-1 < sVar3) {
        if (local_b8 != (PSocketAddress **)0x0) {
          pPVar4 = p_socket_address_new_from_native(&sa,(ulong)optlen);
          *ppPVar1 = pPVar4;
          return sVar3;
        }
        return sVar3;
      }
      err_code = p_error_get_last_net();
    } while ((err_code == 4) ||
            ((code = p_error_get_io_from_system(err_code), (socket->field_0x18 & 1) != 0 &&
             (code == P_ERROR_IO_WOULD_BLOCK))));
    message = "Failed to call recvfrom() on socket";
  }
  p_error_set_error_p(error,code,err_code,message);
  return -1;
}

Assistant:

P_LIB_API pssize
p_socket_receive_from (const PSocket	*socket,
		       PSocketAddress	**address,
		       pchar		*buffer,
		       psize		buflen,
		       PError		**error)
{
	PErrorIO		sock_err;
	struct sockaddr_storage sa;
	socklen_t		optlen;
	pssize			ret;
	pint			err_code;

	if (P_UNLIKELY (socket == NULL || buffer == NULL || buflen == 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return -1;

	optlen = sizeof (sa);

	for (;;) {
		if (socket->blocking &&
		    p_socket_io_condition_wait (socket,
						P_SOCKET_IO_CONDITION_POLLIN,
						error) == FALSE)
			return -1;

		if ((ret = recvfrom (socket->fd,
				     buffer,
				     (socklen_t) buflen,
				     0,
				     (struct sockaddr *) &sa,
				     &optlen)) < 0) {
			err_code = p_error_get_last_net ();

#if !defined (P_OS_WIN) && defined (EINTR)
			if (err_code == EINTR)
				continue;
#endif
			sock_err = p_error_get_io_from_system (err_code);

			if (socket->blocking && sock_err == P_ERROR_IO_WOULD_BLOCK)
				continue;

			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Failed to call recvfrom() on socket");

			return -1;
		}

		break;
	}

	if (address != NULL)
		*address = p_socket_address_new_from_native (&sa, optlen);

	return ret;
}